

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldMapTest_MultipleFieldPathsAsKey_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_MultipleFieldPathsAsKey_Test *this)

{
  UnpackAnyField UVar1;
  bool bVar2;
  TestField *pTVar3;
  uint32_t *puVar4;
  Arena *pAVar5;
  FieldDescriptor *pFVar6;
  char *pcVar7;
  char *in_R9;
  AssertHelper local_678;
  Message local_670;
  undefined1 local_668 [8];
  AssertionResult gtest_ar;
  AssertHelper local_638;
  Message local_630;
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar__2;
  string output;
  AssertHelper local_5d0;
  Message local_5c8;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  FieldDescriptor *local_558;
  allocator<char> local_549;
  string local_548;
  FieldDescriptor *local_528;
  undefined1 local_520 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  key_field_path2;
  string local_500;
  FieldDescriptor *local_4e0;
  allocator<char> local_4d1;
  string local_4d0;
  FieldDescriptor *local_4b0;
  undefined1 local_4a8 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  key_field_path1;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  key_field_paths;
  AssertHelper local_458;
  Message local_450;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_;
  string local_428;
  undefined1 local_408 [8];
  MessageDifferencer differencer;
  Item *item;
  undefined1 local_240 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_RepeatedFieldMapTest_MultipleFieldPathsAsKey_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_240);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::set_a(pTVar3,1);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,2);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,3);
  UVar1 = differencer.unpack_any_field_;
  puVar4 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      ((long)differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>
                             ._M_head_impl + 0x10),0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      UVar1.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             ((long)UVar1.dynamic_message_factory_._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl + 0x88),"a",pAVar5);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::set_a(pTVar3,2);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,1);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,3);
  UVar1 = differencer.unpack_any_field_;
  puVar4 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      ((long)differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>
                             ._M_head_impl + 0x10),0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      UVar1.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             ((long)UVar1.dynamic_message_factory_._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl + 0x88),"b",pAVar5);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::set_a(pTVar3,1);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,1);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,3);
  UVar1 = differencer.unpack_any_field_;
  puVar4 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      ((long)differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>
                             ._M_head_impl + 0x10),0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      UVar1.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             ((long)UVar1.dynamic_message_factory_._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl + 0x88),"c",pAVar5);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_240);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::set_a(pTVar3,1);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,3);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,1);
  UVar1 = differencer.unpack_any_field_;
  puVar4 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      ((long)differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>
                             ._M_head_impl + 0x10),0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      UVar1.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             ((long)UVar1.dynamic_message_factory_._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl + 0x88),"c",pAVar5);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_240);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::set_a(pTVar3,1);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,3);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,2);
  UVar1 = differencer.unpack_any_field_;
  puVar4 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      ((long)differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>
                             ._M_head_impl + 0x10),0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      UVar1.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             ((long)UVar1.dynamic_message_factory_._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl + 0x88),"a",pAVar5);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_240);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::set_a(pTVar3,2);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,3);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,1);
  UVar1 = differencer.unpack_any_field_;
  puVar4 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      ((long)differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>
                             ._M_head_impl + 0x10),0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      UVar1.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             ((long)UVar1.dynamic_message_factory_._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl + 0x88),"b",pAVar5);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"item.m.rc",
             (allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pFVar6 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_428);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)local_408,pFVar6);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  bVar2 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)local_408,(Message *)((long)&msg2.field_0 + 0xa0),
                     (Message *)local_240);
  local_441 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,&local_441,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar2) {
    testing::Message::Message(&local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &key_field_paths.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_440,
               (AssertionResult *)0x1ebd035,"true","false",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8c5,pcVar7);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    std::__cxx11::string::~string
              ((string *)
               &key_field_paths.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            *)&key_field_path1.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"item.m",&local_4d1);
  local_4b0 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_4d0);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_4a8,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"item.m.a",
             (allocator<char> *)
             ((long)&key_field_path2.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_4e0 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_500);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_4a8,&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key_field_path2.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"item.m",&local_549);
  local_528 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_548);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_520,&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"item.m.rc",&local_579);
  local_558 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_578);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_520,&local_558);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::push_back((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)&key_field_path1.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_4a8);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::push_back((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)&key_field_path1.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"item",
             (allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pFVar6 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_5a0);
  util::MessageDifferencer::TreatAsMapWithMultipleFieldPathsAsKey
            ((MessageDifferencer *)local_408,pFVar6,
             (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)&key_field_path1.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_5b9 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_408,(Message *)((long)&msg2.field_0 + 0xa0),
                         (Message *)local_240);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar2) {
    testing::Message::Message(&local_5c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&output.field_2 + 8),(internal *)local_5b8,
               (AssertionResult *)0x1ebd035,"false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8d1,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  proto2_unittest::TestDiffMessage::clear_item((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  proto2_unittest::TestDiffMessage::clear_item((TestDiffMessage *)local_240);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::set_a(pTVar3,4);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,5);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,6);
  UVar1 = differencer.unpack_any_field_;
  puVar4 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      ((long)differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>
                             ._M_head_impl + 0x10),0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      UVar1.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             ((long)UVar1.dynamic_message_factory_._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl + 0x88),"hello",pAVar5);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
        )proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_240);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::set_a(pTVar3,4);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,6);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m
                     ((TestDiffMessage_Item *)
                      differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  proto2_unittest::TestField::add_rc(pTVar3,5);
  UVar1 = differencer.unpack_any_field_;
  puVar4 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)
                      ((long)differencer.unpack_any_field_.dynamic_message_factory_._M_t.
                             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                             .
                             super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>
                             ._M_head_impl + 0x10),0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = protobuf::MessageLite::GetArena
                     ((MessageLite *)
                      UVar1.dynamic_message_factory_._M_t.
                      super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                      .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                      _M_head_impl);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             ((long)UVar1.dynamic_message_factory_._M_t.
                    super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                    .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>.
                    _M_head_impl + 0x88),"world",pAVar5);
  std::__cxx11::string::string((string *)&gtest_ar__2.message_);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)local_408,(string *)&gtest_ar__2.message_);
  bVar2 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)local_408,(Message *)((long)&msg2.field_0 + 0xa0),
                     (Message *)local_240);
  local_621 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_620,&local_621,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar2) {
    testing::Message::Message(&local_630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_620,(AssertionResult *)0x1ebd035,
               "true","false",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8e2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  testing::internal::EqHelper::
  Compare<char[133],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_668,
             "\"modified: item[0].b: \\\"hello\\\" -> \\\"world\\\"\\n\" \"moved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\\n\" \"moved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\\n\""
             ,"output",
             (char (*) [133])
             "modified: item[0].b: \"hello\" -> \"world\"\nmoved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\nmoved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &gtest_ar__2.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar2) {
    testing::Message::Message(&local_670);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_668);
    testing::internal::AssertHelper::AssertHelper
              (&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8e7,pcVar7);
    testing::internal::AssertHelper::operator=(&local_678,&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_678);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_520);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_4a8);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             *)&key_field_path1.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_408);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_240);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_MultipleFieldPathsAsKey) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  // Treat "item" as Map, with key = ("m.a", "m.rc")
  // Treat "item.m.rc" as Set
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  // key => value: (1, {2, 3}) => "a"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(2);
  item->mutable_m()->add_rc(3);
  item->set_b("a");
  item = msg1.add_item();
  // key => value: (2, {1, 3}) => "b"
  item->mutable_m()->set_a(2);
  item->mutable_m()->add_rc(1);
  item->mutable_m()->add_rc(3);
  item->set_b("b");
  item = msg1.add_item();
  // key => value: (1, {1, 3}) => "c"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(1);
  item->mutable_m()->add_rc(3);
  item->set_b("c");

  item = msg2.add_item();
  // key => value: (1, {1, 3}) => "c"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(1);
  item->set_b("c");
  item = msg2.add_item();
  // key => value: (1, {2, 3}) => "a"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(2);
  item->set_b("a");
  item = msg2.add_item();
  // key => value: (2, {1, 3}) => "b"
  item->mutable_m()->set_a(2);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(1);
  item->set_b("b");

  // Compare
  util::MessageDifferencer differencer;
  differencer.TreatAsSet(GetFieldDescriptor(msg1, "item.m.rc"));
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  std::vector<std::vector<const FieldDescriptor*> > key_field_paths;
  std::vector<const FieldDescriptor*> key_field_path1;
  key_field_path1.push_back(GetFieldDescriptor(msg1, "item.m"));
  key_field_path1.push_back(GetFieldDescriptor(msg1, "item.m.a"));
  std::vector<const FieldDescriptor*> key_field_path2;
  key_field_path2.push_back(GetFieldDescriptor(msg1, "item.m"));
  key_field_path2.push_back(GetFieldDescriptor(msg1, "item.m.rc"));
  key_field_paths.push_back(key_field_path1);
  key_field_paths.push_back(key_field_path2);
  differencer.TreatAsMapWithMultipleFieldPathsAsKey(
      GetFieldDescriptor(msg1, "item"), key_field_paths);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));

  // Introduce some differences.
  msg1.clear_item();
  msg2.clear_item();
  item = msg1.add_item();
  item->mutable_m()->set_a(4);
  item->mutable_m()->add_rc(5);
  item->mutable_m()->add_rc(6);
  item->set_b("hello");
  item = msg2.add_item();
  item->mutable_m()->set_a(4);
  item->mutable_m()->add_rc(6);
  item->mutable_m()->add_rc(5);
  item->set_b("world");
  std::string output;
  differencer.ReportDifferencesToString(&output);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: item[0].b: \"hello\" -> \"world\"\n"
      "moved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\n"
      "moved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\n",
      output);
}